

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O0

void __thiscall
cinject::ComponentBuilderBase<IWalker,IRunner,IJumper,ICrawler,ISwimmer,IWaterConsumer,Human>::
registerType<Human,cinject::InstanceStorage<Human,cinject::ConstructorFactory<Human,void>>,IJumper,ICrawler,ISwimmer,IWaterConsumer,Human>
          (ComponentBuilderBase<IWalker,IRunner,IJumper,ICrawler,ISwimmer,IWaterConsumer,Human>
           *this,shared_ptr<cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>_>
                 *instanceStorage)

{
  shared_ptr<cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>_>
  local_48 [2];
  shared_ptr<cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>_> local_28;
  shared_ptr<cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>_> *local_18;
  shared_ptr<cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>_>
  *instanceStorage_local;
  ComponentBuilderBase<IWalker,_IRunner,_IJumper,_ICrawler,_ISwimmer,_IWaterConsumer,_Human>
  *this_local;
  
  local_18 = instanceStorage;
  instanceStorage_local =
       (shared_ptr<cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>_> *)
       this;
  std::shared_ptr<cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>_>::
  shared_ptr(&local_28,instanceStorage);
  addRegistration<Human,cinject::InstanceStorage<Human,cinject::ConstructorFactory<Human,void>>,IJumper>
            (this,&local_28);
  std::shared_ptr<cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>_>::
  ~shared_ptr(&local_28);
  std::shared_ptr<cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>_>::
  shared_ptr(local_48,instanceStorage);
  registerType<Human,cinject::InstanceStorage<Human,cinject::ConstructorFactory<Human,void>>,ICrawler,ISwimmer,IWaterConsumer,Human>
            (this,local_48);
  std::shared_ptr<cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>_>::
  ~shared_ptr(local_48);
  return;
}

Assistant:

void registerType(std::shared_ptr<TInstanceStorage> instanceStorage)
    {
        // register
        addRegistration<TImplementation, TInstanceStorage, TComponent1>(instanceStorage);


        registerType<TImplementation, TInstanceStorage, TComponentOther, TRest...>(instanceStorage);
    }